

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1538.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  uint local_20;
  int local_1c;
  CURLSHcode shareret;
  CURLMcode multiret;
  CURLcode easyret;
  int res;
  char *URL_local;
  
  curl_easy_strerror(0x7fffffff);
  curl_multi_strerror(0x7fffffff);
  curl_share_strerror(0x7fffffff);
  curl_easy_strerror(0x80000001);
  curl_multi_strerror(0x80000001);
  curl_share_strerror(0x80000001);
  for (shareret = CURLSHE_OK; shareret < 0x5f; shareret = shareret + CURLSHE_BAD_OPTION) {
    uVar1 = curl_easy_strerror(shareret);
    curl_mprintf("e%d: %s\n",shareret,uVar1);
  }
  for (local_1c = -1; local_1c < 10; local_1c = local_1c + 1) {
    uVar1 = curl_multi_strerror(local_1c);
    curl_mprintf("m%d: %s\n",local_1c,uVar1);
  }
  for (local_20 = 0; local_20 < 7; local_20 = local_20 + 1) {
    uVar1 = curl_share_strerror(local_20);
    curl_mprintf("s%d: %s\n",local_20,uVar1);
  }
  return 0;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURLcode easyret;
  CURLMcode multiret;
  CURLSHcode shareret;
  (void)URL;

  curl_easy_strerror(INT_MAX);
  curl_multi_strerror(INT_MAX);
  curl_share_strerror(INT_MAX);
  curl_easy_strerror(-INT_MAX);
  curl_multi_strerror(-INT_MAX);
  curl_share_strerror(-INT_MAX);
  for(easyret = CURLE_OK; easyret <= CURL_LAST; easyret++) {
    printf("e%d: %s\n", (int)easyret, curl_easy_strerror(easyret));
  }
  for(multiret = CURLM_CALL_MULTI_PERFORM; multiret <= CURLM_LAST;
      multiret++) {
    printf("m%d: %s\n", (int)multiret, curl_multi_strerror(multiret));
  }
  for(shareret = CURLSHE_OK; shareret <= CURLSHE_LAST; shareret++) {
    printf("s%d: %s\n", (int)shareret, curl_share_strerror(shareret));
  }

  return (int)res;
}